

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# type.c
# Opt level: O1

sysbvm_tuple_t
sysbvm_type_createSimpleFunctionTypeWithArguments0
          (sysbvm_context_t *context,sysbvm_tuple_t resultType)

{
  anon_struct_16_2_94d61efe gcFrame;
  sysbvm_tuple_t local_78;
  sysbvm_tuple_t sStack_70;
  sysbvm_tuple_t local_68 [4];
  sysbvm_stackFrameRecord_t local_48;
  undefined8 local_38;
  undefined1 *puStack_30;
  
  puStack_30 = (undefined1 *)&local_78;
  local_78 = 0;
  sStack_70 = 0;
  local_48.previous = (sysbvm_stackFrameRecord_s *)0x0;
  local_48.type = SYSBVM_STACK_FRAME_RECORD_TYPE_GC_ROOTS;
  local_48._12_4_ = 0;
  local_38 = 2;
  sysbvm_stackFrame_pushRecord(&local_48);
  local_78 = sysbvm_array_create(context,0);
  local_68[1] = 0xb;
  local_68[0] = local_78;
  local_68[2] = resultType;
  sStack_70 = sysbvm_function_apply
                        (context,(context->roots).simpleFunctionTypeTemplate,3,local_68,0);
  sysbvm_stackFrame_popRecord(&local_48);
  return sStack_70;
}

Assistant:

SYSBVM_API sysbvm_tuple_t sysbvm_type_createSimpleFunctionTypeWithArguments0(sysbvm_context_t *context, sysbvm_tuple_t resultType)
{
    struct {
        sysbvm_tuple_t arguments;
        sysbvm_tuple_t result;
    } gcFrame = {0};

    SYSBVM_STACKFRAME_PUSH_GC_ROOTS(gcFrameRecord, gcFrame);
    gcFrame.arguments = sysbvm_array_create(context, 0);
    gcFrame.result = sysbvm_type_createSimpleFunctionType(context, gcFrame.arguments, 0, resultType);

    SYSBVM_STACKFRAME_POP_GC_ROOTS(gcFrameRecord);
    return gcFrame.result;
}